

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_client.cpp
# Opt level: O2

int ep_connect_and_loop(char *host,int port,void *userdata)

{
  int efd;
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  ushort uVar8;
  long lVar9;
  undefined8 uStack_2e0;
  sockaddr local_2d4;
  epoll_event event;
  epoll_event events [10];
  char buf [512];
  
  uVar8 = (ushort)port;
  if (uVar8 == 0) {
    printf("\x1b[31mERROR: %s: %s: %d: port number is wrong:%d\x1b[m\n","epoll_client.cpp",
           "ep_connect_and_loop",0x26,0);
  }
  else {
    efd = epoll_create(10);
    if (efd == -1) {
      pcVar7 = "\x1b[31mERROR: %s: %s: %d: epoll_create error!\x1b[m\n";
      uStack_2e0 = 0x2f;
    }
    else {
      sk_on_start(efd,userdata);
      iVar1 = socket(2,1,6);
      if (iVar1 != -1) {
        local_2d4.sa_data[10] = '\0';
        local_2d4.sa_data[0xb] = '\0';
        local_2d4.sa_data[0xc] = '\0';
        local_2d4.sa_data[0xd] = '\0';
        local_2d4.sa_data[2] = '\0';
        local_2d4.sa_data[3] = '\0';
        local_2d4.sa_data[4] = '\0';
        local_2d4.sa_data[5] = '\0';
        local_2d4.sa_data[6] = '\0';
        local_2d4.sa_data[7] = '\0';
        local_2d4.sa_data[8] = '\0';
        local_2d4.sa_data[9] = '\0';
        local_2d4.sa_family = 2;
        local_2d4.sa_data._0_2_ = uVar8 << 8 | uVar8 >> 8;
        iVar2 = inet_pton(2,host,local_2d4.sa_data + 2);
        if (iVar2 == 0) {
          printf("\x1b[31mERROR: %s: %s: %d: inet_pton failed, invalid address!\x1b[m\n",
                 "epoll_client.cpp","ep_connect_and_loop",0x47);
          close(iVar1);
          return -1;
        }
        if (iVar2 < 0) {
          pcVar7 = "\x1b[31mERROR: %s: %s: %d: inet_pton failed\x1b[m\n";
          uStack_2e0 = 0x4d;
        }
        else {
          iVar2 = connect(iVar1,&local_2d4,0x10);
          if (-1 < iVar2) {
            sk_on_connected(efd,iVar1);
            set_non_block(iVar1);
            event.events = 0x80000005;
            event.data.fd = iVar1;
            epoll_ctl(efd,1,iVar1,(epoll_event *)&event);
            do {
              uVar3 = epoll_wait(efd,(epoll_event *)events,10,-1);
              uVar4 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar4 = 0;
              }
              for (lVar9 = 0; uVar4 * 0xc - lVar9 != 0; lVar9 = lVar9 + 0xc) {
                if ((*(byte *)((long)&events[0].events + lVar9) & 1) != 0) {
                  iVar1 = *(int *)((long)&events[0].data + lVar9);
                  sVar5 = read(iVar1,buf,0x200);
                  iVar2 = (int)sVar5;
                  if (iVar2 == -1) {
                    piVar6 = __errno_location();
                    if (*piVar6 == 0xb) break;
                    sk_on_read_error(efd,iVar1);
                  }
                  else if (iVar2 == 0) {
                    close(*(int *)((long)&events[0].data + lVar9));
                    sk_on_disconnected(efd,iVar1);
                    break;
                  }
                  sk_on_read_data(efd,iVar1,(byte *)buf,iVar2);
                }
              }
            } while( true );
          }
          pcVar7 = "\x1b[31mERROR: %s: %s: %d: connect failed\x1b[m\n";
          uStack_2e0 = 0x55;
        }
        printf(pcVar7,"epoll_client.cpp","ep_connect_and_loop",uStack_2e0);
        close(iVar1);
        goto LAB_00107544;
      }
      pcVar7 = "\x1b[31mERROR: %s: %s: %d: open socket failed!\x1b[m\n";
      uStack_2e0 = 0x39;
    }
    printf(pcVar7,"epoll_client.cpp","ep_connect_and_loop",uStack_2e0);
  }
LAB_00107544:
  sk_on_global_error();
  return -1;
}

Assistant:

int ep_connect_and_loop(const char *host, int port, void *userdata)
{
    int ret = RET_OK;

    in_port_t i16_port = port;
    if(0 >= i16_port)
    {
        LOGE("port number is wrong:%d", i16_port);
        sk_on_global_error();
        return RET_ERR;
    }

    int efd;
    efd = epoll_create(10);
    if(efd == -1)
    {
        LOGE("epoll_create error!");
        sk_on_global_error();
        return RET_ERR;
    }

    sk_on_start(efd, userdata);

    int sk = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(-1 == sk)
    {
        LOGE("open socket failed!");
        sk_on_global_error();
        return RET_ERR;
    }

    struct sockaddr_in sa = {0};
    sa.sin_family = AF_INET;
    sa.sin_port = htons(i16_port);

    struct sockaddr_in *psa = &sa;

    ret = inet_pton(AF_INET, host, &psa->sin_addr.s_addr);
    if(0 == ret)
    {
        LOGE("inet_pton failed, invalid address!");
        close(sk);
        return RET_ERR;
    }
    else if(ret < 0)
    {
        LOGE("inet_pton failed");
        close(sk);
        sk_on_global_error();
        return RET_ERR;
    }

    if(connect(sk, (struct sockaddr*)&sa, sizeof(sa)) < 0)
    {
        LOGE("connect failed");
        close(sk);
        sk_on_global_error();
        return RET_ERR;
    } else {
        sk_on_connected(efd, sk);
    }

    set_non_block(sk);

    struct epoll_event event;
    struct epoll_event events[10];

    event.events = EPOLLOUT | EPOLLIN | EPOLLET;
    event.data.fd = sk;

    epoll_ctl(efd, EPOLL_CTL_ADD, sk, &event);

    while(1)
    {
        int cnt = epoll_wait(efd, events, 10, -1);
        for (int i = 0; i < cnt; i++)
        {
            if(events[i].events & EPOLLIN)
            {
                char buf[BUF_SIZE];
                int fd = events[i].data.fd;
                int len = read(fd, buf, BUF_SIZE);
                if (len == -1) {
                    if (errno == EAGAIN) {
                        break;
                    }

                    sk_on_read_error(efd, fd);

                } else if (len == 0) {
                    close(events[i].data.fd);
                    sk_on_disconnected(efd, fd);
                    break;
                }

                sk_on_read_data(efd, fd, (byte*)buf, len);
            }
        }
    }

    close(sk);
    close(efd);

    return RET_OK;
}